

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

string * __thiscall
argparse::details::repr<std::__cxx11::string>
          (string *__return_storage_ptr__,details *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,*(long *)this,*(long *)(this + 8) + *(long *)this);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                     (&local_38,0,1,'\"');
  local_58._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar4) {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_58,local_58._M_string_length,0,1,'\"');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string repr(T const &val) {
  if constexpr (std::is_same_v<T, bool>) {
    return val ? "true" : "false";
  } else if constexpr (std::is_convertible_v<T, std::string_view>) {
    return '"' + std::string{std::string_view{val}} + '"';
  } else if constexpr (IsContainer<T>) {
    std::stringstream out;
    out << "{";
    const auto size = val.size();
    if (size > 1) {
      out << repr(*val.begin());
      std::for_each(
          std::next(val.begin()),
          std::next(
              val.begin(),
              static_cast<typename T::iterator::difference_type>(
                  std::min<std::size_t>(size, repr_max_container_size) - 1)),
          [&out](const auto &v) { out << " " << repr(v); });
      if (size <= repr_max_container_size) {
        out << " ";
      } else {
        out << "...";
      }
    }
    if (size > 0) {
      out << repr(*std::prev(val.end()));
    }
    out << "}";
    return out.str();
  } else if constexpr (IsStreamable<T>) {
    std::stringstream out;
    out << val;
    return out.str();
  } else {
    return "<not representable>";
  }
}